

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer ppVar2;
  undefined8 uVar3;
  cmState *this_00;
  string *psVar4;
  ostream *poVar5;
  pointer ppVar6;
  char *pcVar7;
  cmListFileContext lfc;
  cmStateDirectory cmDir;
  undefined1 local_c8 [32];
  string local_a8;
  undefined8 local_88;
  cmTarget *local_80;
  string local_78;
  cmStateDirectory local_58;
  
  pcVar7 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar7 = "keyword";
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"The uses of the ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (s,pcVar7,(ulong)(sig == KeywordTLLSignature) * 2 + 5);
  std::__ostream_insert<char,std::char_traits<char>>(s," signature are here:\n",0x15);
  cmMakefile::GetStateSnapshot
            (((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
  cmStateSnapshot::GetDirectory(&local_58,(cmStateSnapshot *)local_c8);
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  ppVar6 = *(pointer *)
            &((_Var1._M_head_impl)->TLLCommands).
             super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ;
  ppVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->TLLCommands + 8);
  if (ppVar6 != ppVar2) {
    local_80 = this;
    do {
      if (ppVar6->first == sig) {
        local_c8._0_8_ = local_c8 + 0x10;
        uVar3 = (ppVar6->second).Name._M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,uVar3,*(size_type *)((long)&ppVar6->second + 8) + uVar3);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        uVar3 = ((string *)((long)&ppVar6->second + 0x20))->_M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,uVar3,*(size_type *)((long)&ppVar6->second + 0x28) + uVar3);
        local_88 = *(long *)((long)&ppVar6->second + 0x40);
        this_00 = cmMakefile::GetState
                            (((local_80->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             Makefile);
        psVar4 = cmState::GetSourceDirectory_abi_cxx11_(this_00);
        cmStateDirectory::ConvertToRelPathIfNotContained(&local_78,&local_58,psVar4,&local_a8);
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(s," * ",3);
        poVar5 = operator<<(s,(cmListFileContext *)local_c8);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar2);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  cmStateDirectory cmDir = impl->Makefile->GetStateSnapshot().GetDirectory();
  for (auto const& cmd : impl->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmDir.ConvertToRelPathIfNotContained(
        impl->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}